

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::Read
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,TPZStream *buf,void *context)

{
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *this_00;
  size_t *psVar1;
  TPZCompElHDiv<pzshape::TPZShapeLinear> *pTVar2;
  long *plVar3;
  int iVar4;
  long **pplVar5;
  _Node *p_Var6;
  ostream *poVar7;
  size_t sVar8;
  int iVar9;
  int classid;
  int sz;
  TPZOneShapeRestraint one;
  int local_258;
  int local_254;
  TPZCompElHDiv<pzshape::TPZShapeLinear> *local_250;
  TPZManVector<int,_2> local_248;
  undefined **local_220;
  undefined **local_218;
  undefined **local_210;
  TPZVec<int> local_208;
  int local_1e8 [4];
  long *local_1d8;
  long local_1c8 [2];
  undefined1 local_1b8 [24];
  int64_t local_1a0;
  pair<long,_int> local_198 [4];
  undefined **local_158;
  ios_base *local_150;
  int64_t local_140;
  ios_base local_138 [264];
  
  TPZInterpolatedElement::Read((TPZInterpolatedElement *)this,buf,context);
  pplVar5 = TPZVec<long>::begin(&(this->fConnectIndexes).super_TPZVec<long>);
  (*buf->_vptr_TPZStream[0x1f])(buf,*pplVar5,3);
  TPZVec<int>::TPZVec(&local_208,0);
  local_218 = &PTR__TPZManVector_018437d0;
  local_208._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018437d0;
  local_208.fStore = local_1e8;
  local_208.fNElements = 0;
  local_208.fNAlloc = 0;
  TPZStream::Read<int>(buf,&local_208,(void *)0x0);
  TPZInt1d::SetOrder(&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).fIntRule,&local_208,0);
  TPZVec<int>::TPZVec(&local_248.super_TPZVec<int>,0);
  local_248.super_TPZVec<int>.fStore = local_248.fExtAlloc;
  local_220 = &PTR__TPZManVector_018443d0;
  local_248.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018443d0;
  local_248.super_TPZVec<int>.fNElements = 0;
  local_248.super_TPZVec<int>.fNAlloc = 0;
  TPZStream::Read<int>(buf,&local_248.super_TPZVec<int>,(void *)0x0);
  TPZManVector<int,_2>::operator=(&this->fSideOrient,&local_248);
  pplVar5 = TPZVec<long>::begin(&(this->fConnectIndexes).super_TPZVec<long>);
  (*buf->_vptr_TPZStream[0x1f])(buf,*pplVar5,3);
  (*buf->_vptr_TPZStream[0x1d])
            (buf,&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
                  super_TPZInterpolationSpace.fPreferredOrder,1);
  TPZStream::Read<int>(buf,&(this->fSideOrient).super_TPZVec<int>,(void *)0x0);
  local_250 = this;
  (*buf->_vptr_TPZStream[0x1d])(buf,&local_254,1);
  if (0 < local_254) {
    this_00 = &local_250->fRestraints;
    iVar9 = 0;
    local_210 = &PTR__TPZManVector_018e5370;
    do {
      TPZOneShapeRestraint::TPZOneShapeRestraint((TPZOneShapeRestraint *)local_1b8);
      TPZOneShapeRestraint::Read((TPZOneShapeRestraint *)local_1b8,buf);
      p_Var6 = std::__cxx11::list<TPZOneShapeRestraint,std::allocator<TPZOneShapeRestraint>>::
               _M_create_node<TPZOneShapeRestraint_const&>
                         ((list<TPZOneShapeRestraint,std::allocator<TPZOneShapeRestraint>> *)this_00
                          ,(TPZOneShapeRestraint *)local_1b8);
      std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
      psVar1 = &(local_250->fRestraints).
                super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (local_150 == local_138) {
        local_150 = (ios_base *)0x0;
      }
      local_140 = 0;
      local_158 = &PTR__TPZVec_0183b5b0;
      if (local_150 != (ios_base *)0x0) {
        operator_delete__(local_150);
      }
      if ((pair<long,_int> *)local_1b8._8_8_ == local_198) {
        local_1b8._8_8_ = (pair<long,_int> *)0x0;
      }
      local_1a0 = 0;
      local_1b8._0_8_ = &PTR__TPZVec_0191fdb8;
      if ((pair<long,_int> *)local_1b8._8_8_ != (pair<long,_int> *)0x0) {
        operator_delete__((void *)local_1b8._8_8_);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < local_254);
  }
  local_258 = -1;
  (*buf->_vptr_TPZStream[0x1d])(buf,&local_258,1);
  pTVar2 = local_250;
  iVar9 = local_258;
  iVar4 = (**(code **)(*(long *)&(local_250->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x20))(local_250);
  if (iVar9 != iVar4) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar7 = (ostream *)(local_1b8 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"ERROR - ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "virtual void TPZCompElHDiv<pzshape::TPZShapeLinear>::Read(TPZStream &, void *) [TSHAPE = pzshape::TPZShapeLinear]"
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," trying to restore an object id ",0x20);
    iVar9 = (**(code **)(*(long *)&(pTVar2->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x20))(pTVar2);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," and classid read = ",0x14);
    std::ostream::operator<<(poVar7,local_258);
    std::__cxx11::stringbuf::str();
    plVar3 = local_1d8;
    if (local_1d8 == (long *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a5d2a8);
    }
    else {
      sVar8 = strlen((char *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)plVar3,sVar8)
      ;
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_248.super_TPZVec<int>.fStore == local_248.fExtAlloc) {
    local_248.super_TPZVec<int>.fStore = (int *)0x0;
  }
  local_248.super_TPZVec<int>.fNAlloc = 0;
  local_248.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_248.super_TPZVec<int>.fStore != (int *)0x0) {
    operator_delete__(local_248.super_TPZVec<int>.fStore);
  }
  if (local_208.fStore == local_1e8) {
    local_208.fStore = (int *)0x0;
  }
  local_208.fNAlloc = 0;
  local_208._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_208.fStore != (int *)0x0) {
    operator_delete__(local_208.fStore);
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::Read(TPZStream &buf, void *context)
{
	TPZInterpolatedElement::Read(buf,context);
  buf.Read(fConnectIndexes.begin(),TSHAPE::NSides);
	TPZManVector<int,3> order;
	buf.Read(order);
	this-> fIntRule.SetOrder(order);
    TPZManVector<int, TSHAPE::NFacets> SideOrient;
    buf.Read(SideOrient);
    fSideOrient = SideOrient;
	buf.Read(this->fConnectIndexes.begin(),TSHAPE::NSides);
	buf.Read(&this->fPreferredOrder,1);
    buf.Read(fSideOrient);
    int sz;
    buf.Read(&sz);
    for (int i=0; i<sz; i++) {
        TPZOneShapeRestraint one;
        one.Read(buf);
        fRestraints.push_back(one);
    }
	int classid = -1;
	buf.Read( &classid, 1 );
	if ( classid != this->ClassId())
	{
		std::stringstream sout;
		sout << "ERROR - " << __PRETTY_FUNCTION__
        << " trying to restore an object id " << this->ClassId() << " and classid read = " << classid;
		LOGPZ_ERROR ( logger, sout.str().c_str() );
	}
}